

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Performance::lineParamsString_abi_cxx11_
          (string *__return_storage_ptr__,Performance *this,LineParameters *params)

{
  string local_c8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Performance *local_18;
  LineParameters *params_local;
  
  local_18 = this;
  params_local = (LineParameters *)__return_storage_ptr__;
  de::toString<float>(&local_98,(float *)this);
  std::operator+(&local_78,"y = ",&local_98);
  std::operator+(&local_58,&local_78," + ");
  de::toString<float>(&local_c8,(float *)(local_18 + 4));
  std::operator+(&local_38,&local_58,&local_c8);
  std::operator+(__return_storage_ptr__,&local_38,"*x");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

static string lineParamsString (const LineParameters& params)
{
	return "y = " + de::toString(params.offset) + " + " + de::toString(params.coefficient) + "*x";
}